

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void Lodtalk::nativeErrorFormat(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_528 [8];
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  allocator local_459;
  string local_458;
  undefined4 local_438;
  undefined4 local_434;
  va_list args;
  char local_418 [8];
  char buffer [1024];
  char *format_local;
  
  if (in_AL != '\0') {
    local_4f8 = in_XMM0_Qa;
    local_4e8 = in_XMM1_Qa;
    local_4d8 = in_XMM2_Qa;
    local_4c8 = in_XMM3_Qa;
    local_4b8 = in_XMM4_Qa;
    local_4a8 = in_XMM5_Qa;
    local_498 = in_XMM6_Qa;
    local_488 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_528;
  args[0]._0_8_ = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 8;
  local_520 = in_RSI;
  local_518 = in_RDX;
  local_510 = in_RCX;
  local_508 = in_R8;
  local_500 = in_R9;
  vsnprintf(local_418,0x400,format,&local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,local_418,&local_459);
  nativeError(&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  return;
}

Assistant:

void nativeErrorFormat(const char *format, ...)
{
    char buffer[1024];
    va_list args;
    va_start(args, format);
    vsnprintf(buffer, 1024, format, args);
	va_end(args);

	nativeError(buffer);
}